

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_TEXKILL(Context *ctx)

{
  size_t in_RDX;
  char dst [64];
  char acStack_58 [72];
  
  get_ARB1_destarg_varname(ctx,acStack_58,in_RDX);
  output_line(ctx,"KIL %s.xyzx;",acStack_58);
  return;
}

Assistant:

static void emit_ARB1_TEXKILL(Context *ctx)
{
    // d3d kills on xyz, arb1 kills on xyzw. Fix the swizzle.
    //  We just map the x component to w. If it's negative, the fragment
    //  would discard anyhow, otherwise, it'll pass through okay. This saves
    //  us a temp register.
    char dst[64];
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    output_line(ctx, "KIL %s.xyzx;", dst);
}